

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero-delay-observer.cpp
# Opt level: O0

void __thiscall
stateObservation::ZeroDelayObserver::pushInput(ZeroDelayObserver *this,InputVector *u_k)

{
  bool bVar1;
  uint uVar2;
  TimeSize TVar3;
  TimeIndex k;
  InputVector *u_k_local;
  ZeroDelayObserver *this_local;
  
  if (0 < (this->super_ObserverBase).p_) {
    uVar2 = (*(this->super_ObserverBase)._vptr_ObserverBase[0x1c])(this,u_k);
    if ((uVar2 & 1) == 0) {
      __assert_fail("checkInputVector(u_k) && \"The size of the input vector is incorrect\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/mehdi-benallegue[P]state-observation/src/zero-delay-observer.cpp"
                    ,0x6e,
                    "virtual void stateObservation::ZeroDelayObserver::pushInput(const ObserverBase::InputVector &)"
                   );
    }
    TVar3 = IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
            ::size(&this->u_);
    if (TVar3 < 1) {
      bVar1 = IndexedMatrixT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_false>::isSet(&this->x_);
      if (!bVar1) {
        __assert_fail("x_.isSet() && \"Unable to initialize input without time index, the state vector has not been set.\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/mehdi-benallegue[P]state-observation/src/zero-delay-observer.cpp"
                      ,0x76,
                      "virtual void stateObservation::ZeroDelayObserver::pushInput(const ObserverBase::InputVector &)"
                     );
      }
      k = IndexedMatrixT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_false>::getTime(&this->x_);
      IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
      ::setValue(&this->u_,u_k,k);
    }
    else {
      IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
      ::pushBack(&this->u_,u_k);
    }
  }
  return;
}

Assistant:

void ZeroDelayObserver::pushInput(const ObserverBase::InputVector & u_k)
{
  if(p_ > 0)
  {
    BOOST_ASSERT(checkInputVector(u_k) && "The size of the input vector is incorrect");

    if(u_.size() > 0)
    {
      u_.pushBack(u_k);
    }
    else
    {
      BOOST_ASSERT(x_.isSet() && "Unable to initialize input without time index, the state vector has not been set.");
      /// we need the input at the time of the state vector to predict the next one
      u_.setValue(u_k, x_.getTime());
    }
  }
}